

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sLongShaderTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles3::Stress::anon_unknown_0::LongShaderGenerator::makeExpression
          (string *__return_storage_ptr__,LongShaderGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *varNames,int numOps)

{
  char __rhs;
  const_reference pvVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  undefined1 local_e0 [8];
  string varName;
  allocator<char> local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [8];
  string op;
  int ndx;
  allocator<char> local_49;
  string local_48 [8];
  string operators;
  int numOps_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *varNames_local;
  LongShaderGenerator *this_local;
  string *expr;
  
  operators.field_2._12_4_ = numOps;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,"+-*/",&local_49);
  std::allocator<char>::~allocator(&local_49);
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  pvVar1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](varNames,0);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)pvVar1);
  for (op.field_2._12_4_ = 1; (int)op.field_2._12_4_ <= (int)operators.field_2._12_4_;
      op.field_2._12_4_ = op.field_2._12_4_ + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"",&local_a9);
    first._M_current = (char *)std::__cxx11::string::begin();
    varName.field_2._8_8_ = std::__cxx11::string::end();
    __rhs = de::Random::choose<char,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      (&this->m_rnd,first,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )varName.field_2._8_8_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                   &local_a8,__rhs);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator(&local_a9);
    pvVar1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](varNames,(long)(int)op.field_2._12_4_);
    std::__cxx11::string::string((string *)local_e0,(string *)pvVar1);
    std::operator+(&local_140," ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
    std::operator+(&local_120,&local_140," ");
    std::operator+(&local_100,&local_120,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)local_e0);
    std::__cxx11::string::~string((string *)local_88);
  }
  std::__cxx11::string::~string(local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string LongShaderGenerator::makeExpression (const std::vector<std::string>& varNames, const int numOps)
{
	const std::string	operators	= "+-*/";
	std::string			expr;

	DE_ASSERT(varNames.size() > (size_t)numOps);

	expr = varNames[0];

	for (int ndx = 1; ndx <= numOps; ndx++)
	{
		const std::string	op		= std::string("") + m_rnd.choose<char>(operators.begin(), operators.end());
		const std::string	varName	= varNames[ndx];

		expr += " " + op + " " + varName;
	}

	return expr;
}